

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O0

bool __thiscall HawkTracer::client::TracepointMap::load_map(TracepointMap *this,string *map_file)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  long *plVar4;
  mapped_type *this_00;
  MapInfo local_2c0;
  string local_280 [8];
  string category;
  ulong local_260;
  uint64_t label;
  string label_str;
  istream local_228 [8];
  ifstream file;
  string *map_file_local;
  TracepointMap *this_local;
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open(local_228,map_file,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::string((string *)&label);
    std::__cxx11::string::string(local_280);
    while( true ) {
      piVar3 = std::operator>>(local_228,local_280);
      piVar3 = std::operator>>(piVar3,(string *)&label);
      plVar4 = (long *)std::istream::operator>>(piVar3,&local_260);
      bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::string::string((string *)&local_2c0,(string *)&label);
      std::__cxx11::string::string((string *)&local_2c0.category,local_280);
      this_00 = std::
                unordered_map<unsigned_long,_HawkTracer::client::TracepointMap::MapInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>_>
                ::operator[](&this->_input_map,&local_260);
      MapInfo::operator=(this_00,&local_2c0);
      MapInfo::~MapInfo(&local_2c0);
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string((string *)&label);
  }
  std::ifstream::~ifstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool TracepointMap::load_map(const std::string& map_file)
{
    std::ifstream file;
    file.open(map_file);

    if (!file.is_open())
    {
        return false;
    }

    std::string label_str;
    uint64_t label;
    std::string category;
    while (file >> category >> label_str >> label)
    {
        _input_map[label] = MapInfo{ label_str, category };
    }

    return true;
}